

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateTimeCanonicalRepresentation
          (XMLDateTime *this,MemoryManager *memMgr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  XMLSize_t maxChars;
  XMLCh *miliEndPtr;
  XMLCh *miliStartPtr;
  XMLCh *local_68;
  int local_5c;
  long local_58;
  XMLCh *local_50;
  XMLCh *local_48;
  XMLCh *local_40;
  XMLCh *local_38;
  XMLCh *__src;
  XMLCh *pXVar3;
  
  searchMiliSeconds(this,&local_38,&local_40);
  local_50 = local_40;
  local_48 = local_38;
  local_58 = (long)local_40 - (long)local_38;
  maxChars = local_58 >> 1;
  local_5c = this->fValue[7];
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar1 = (*memMgr->_vptr_MemoryManager[3])
                    (memMgr,((maxChars + 1) - (ulong)(local_5c == 0)) * 2 + 0x2c);
  __src = (XMLCh *)CONCAT44(extraout_var,iVar1);
  local_68 = __src;
  iVar1 = fillYearString(this,&local_68,this->fValue[0]);
  if (iVar1 != 0) {
    iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,((long)iVar1 + maxChars) * 2 + 0x2e);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    memmove(pXVar3,__src,(long)iVar1 * 2 + 8);
    lVar4 = (long)local_68 - (long)__src;
    (*memMgr->_vptr_MemoryManager[4])(memMgr,__src);
    local_68 = (XMLCh *)(lVar4 + (long)pXVar3);
    __src = pXVar3;
  }
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[1],2);
  *local_68 = L'-';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[2],2);
  *local_68 = L'T';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[3],2);
  if (this->fValue[3] == 0x18) {
    local_68[-2] = L'0';
    local_68[-1] = L'0';
  }
  *local_68 = L':';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[4],2);
  *local_68 = L':';
  local_68 = local_68 + 1;
  fillString(this,&local_68,this->fValue[5],2);
  pXVar3 = local_68;
  if (local_50 != local_48) {
    *local_68 = L'.';
    XMLString::copyNString(local_68 + 1,local_48,maxChars);
    local_68 = (XMLCh *)((long)pXVar3 + local_58 + 2);
  }
  if (local_5c != 0) {
    *local_68 = L'Z';
    local_68 = local_68 + 1;
  }
  *local_68 = L'\0';
  return __src;
}

Assistant:

XMLCh* XMLDateTime::getDateTimeCanonicalRepresentation(MemoryManager* const memMgr) const
{
    XMLCh *miliStartPtr, *miliEndPtr;
    searchMiliSeconds(miliStartPtr, miliEndPtr);
    XMLSize_t miliSecondsLen = miliEndPtr - miliStartPtr;
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (21 + miliSecondsLen + utcSize + 1) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    // (-?) cc+yy-mm-dd'T'hh:mm:ss'Z'    ('.'s+)?
    //      2+  8       1      8   1
    //
    int additionalLen = fillYearString(retPtr, fValue[CentYear]);
    if(additionalLen != 0)
    {
        // very bad luck; have to resize the buffer...
        XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen+21+miliSecondsLen +2) * sizeof(XMLCh));
        XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
        retPtr = tmpBuf+(retPtr-retBuf);
        toUse->deallocate(retBuf);
        retBuf = tmpBuf;
    }
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Month], 2);
    *retPtr++ = DATE_SEPARATOR;
    fillString(retPtr, fValue[Day], 2);
    *retPtr++ = DATETIME_SEPARATOR;

    fillString(retPtr, fValue[Hour], 2);
    if (fValue[Hour] == 24)
    {
        *(retPtr - 2) = chDigit_0;
        *(retPtr - 1) = chDigit_0;
    }
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Minute], 2);
    *retPtr++ = TIME_SEPARATOR;
    fillString(retPtr, fValue[Second], 2);

    if (miliSecondsLen)
    {
        *retPtr++ = chPeriod;
        XMLString::copyNString(retPtr, miliStartPtr, miliSecondsLen);
        retPtr += miliSecondsLen;
    }

    if (utcSize)
        *retPtr++ = UTC_STD_CHAR;
    *retPtr = chNull;

    return retBuf;
}